

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void jsimd_h2v1_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  
  if ((simd_support & 0x80) == 0) {
    jsimd_h2v1_downsample_sse2
              (*(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0x13c),
               *(undefined4 *)(in_RSI + 0xc),*(undefined4 *)(in_RSI + 0x1c),in_RDX,in_RCX);
  }
  else {
    jsimd_h2v1_downsample_avx2
              (*(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0x13c),
               *(undefined4 *)(in_RSI + 0xc),*(undefined4 *)(in_RSI + 0x1c),in_RDX,in_RCX);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v1_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                      JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v1_downsample_avx2(cinfo->image_width, cinfo->max_v_samp_factor,
                               compptr->v_samp_factor,
                               compptr->width_in_blocks, input_data,
                               output_data);
  else
    jsimd_h2v1_downsample_sse2(cinfo->image_width, cinfo->max_v_samp_factor,
                               compptr->v_samp_factor,
                               compptr->width_in_blocks, input_data,
                               output_data);
}